

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O1

void __thiscall
fmt::impl::counting_ostream<char,std::char_traits<char>>::~counting_ostream
          (counting_ostream<char,std::char_traits<char>> *this)

{
  ios_base *this_00;
  long lVar1;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  this_00 = (ios_base *)(this + lVar1 + 0x58);
  *(undefined ***)(this_00 + -0x58) = &PTR__counting_ostream_001a7308;
  *(undefined ***)this_00 = &PTR__counting_ostream_001a7330;
  *(code **)(this_00 + -0x50) = sysconf;
  std::locale::~locale((locale *)(this + lVar1 + 0x40));
  std::ios_base::~ios_base(this_00);
  operator_delete(this + lVar1,0x160);
  return;
}

Assistant:

counting_ostream(std::basic_ostream<CharT, Traits>& out) :
	    Base(&sbuf), sbuf(*(out.rdbuf())) {
	 /* inherit locale from our base stream */
	 this->imbue(out.getloc());
      }